

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_common.cc
# Opt level: O3

void google::protobuf::compiler::java::SetCommonOneofVariables
               (FieldDescriptor *descriptor,OneofGeneratorInfo *info,
               flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *buffer;
  anon_union_8_1_a8a14541_for_iterator_2 buffer_00;
  OneofDescriptor *pOVar1;
  Nonnull<char_*> pcVar2;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *field;
  AlphaNum *in_R8;
  string local_f8;
  AlphaNum local_d8;
  string local_a8;
  undefined1 local_78 [48];
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_48;
  
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[11]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_a8,variables,(char (*) [11])0x12e0c8e);
  std::__cxx11::string::_M_assign((string *)(local_a8._M_string_length + 0x10));
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[23]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_a8,variables,(char (*) [23])"oneof_capitalized_name");
  std::__cxx11::string::_M_assign((string *)(local_a8._M_string_length + 0x10));
  pOVar1 = (descriptor->scope_).containing_oneof;
  if (pOVar1 != (OneofDescriptor *)0x0) {
    buffer = &local_a8.field_2;
    pcVar2 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                       ((int)((ulong)((long)pOVar1 - (long)pOVar1->containing_type_->oneof_decls_)
                             >> 3) * -0x49249249,buffer->_M_local_buf);
    local_a8._M_dataplus._M_p = pcVar2 + -(long)buffer;
    local_d8.piece_._M_len = (size_t)local_d8.digits_;
    local_a8._M_string_length = (size_type)buffer;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,buffer,pcVar2);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[12]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)local_78,variables,(char (*) [12])"oneof_index");
    std::__cxx11::string::operator=((string *)(local_78._8_8_ + 0x10),(string *)&local_d8);
    field = extraout_RDX;
    if ((char *)local_d8.piece_._M_len != local_d8.digits_) {
      operator_delete((void *)local_d8.piece_._M_len,local_d8.digits_._0_8_ + 1);
      field = extraout_RDX_00;
    }
    GetOneofStoredType_abi_cxx11_(&local_a8,(java *)descriptor,field);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[18]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_d8,variables,(char (*) [18])"oneof_stored_type");
    std::__cxx11::string::operator=((string *)(local_d8.piece_._M_str + 0x10),(string *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != buffer) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    local_a8._M_string_length = (size_type)(info->name)._M_dataplus._M_p;
    local_a8._M_dataplus._M_p = (pointer)(info->name)._M_string_length;
    local_d8.piece_._M_len = (size_t)&DAT_00000008;
    local_d8.piece_._M_str = "Case_ = ";
    buffer_00.slot_ = (slot_type *)(local_78 + 0x10);
    pcVar2 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                       (descriptor->number_,(Nonnull<char_*>)buffer_00.slot_);
    local_78._0_8_ = pcVar2 + -(long)buffer_00.slot_;
    local_78._8_8_ = buffer_00.slot_;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_f8,(lts_20250127 *)&local_a8,&local_d8,(AlphaNum *)local_78,in_R8);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[23]>
              (&local_48,variables,(char (*) [23])"set_oneof_case_message");
    std::__cxx11::string::operator=
              ((string *)((long)local_48.first.field_1.slot_ + 0x10),(string *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    local_a8._M_string_length = (size_type)(info->name)._M_dataplus._M_p;
    local_a8._M_dataplus._M_p = (pointer)(info->name)._M_string_length;
    local_d8.piece_._M_len = (size_t)&DAT_00000009;
    local_d8.piece_._M_str = "Case_ = 0";
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_78,(lts_20250127 *)&local_a8,&local_d8,
               (AlphaNum *)local_a8._M_dataplus._M_p);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[25]>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_f8,variables,(char (*) [25])"clear_oneof_case_message");
    std::__cxx11::string::operator=((string *)(local_f8._M_string_length + 0x10),(string *)local_78)
    ;
    if ((slot_type *)local_78._0_8_ != buffer_00.slot_) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
    local_a8._M_string_length = (size_type)(info->name)._M_dataplus._M_p;
    local_a8._M_dataplus._M_p = (pointer)(info->name)._M_string_length;
    local_d8.piece_._M_len = (size_t)&DAT_00000009;
    local_d8.piece_._M_str = "Case_ == ";
    pcVar2 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                       (descriptor->number_,(Nonnull<char_*>)buffer_00.slot_);
    local_78._0_8_ = pcVar2 + -(long)buffer_00.slot_;
    local_78._8_8_ = buffer_00.slot_;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_f8,(lts_20250127 *)&local_a8,&local_d8,(AlphaNum *)local_78,in_R8);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[23]>
              (&local_48,variables,(char (*) [23])"has_oneof_case_message");
    std::__cxx11::string::operator=
              ((string *)((long)local_48.first.field_1.slot_ + 0x10),(string *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  protobuf::internal::protobuf_assumption_failed
            ("res != nullptr",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
             ,0xb31);
}

Assistant:

void SetCommonOneofVariables(
    const FieldDescriptor* descriptor, const OneofGeneratorInfo* info,
    absl::flat_hash_map<absl::string_view, std::string>* variables) {
  (*variables)["oneof_name"] = info->name;
  (*variables)["oneof_capitalized_name"] = info->capitalized_name;
  (*variables)["oneof_index"] =
      absl::StrCat(descriptor->containing_oneof()->index());
  (*variables)["oneof_stored_type"] = GetOneofStoredType(descriptor);
  (*variables)["set_oneof_case_message"] =
      absl::StrCat(info->name, "Case_ = ", descriptor->number());
  (*variables)["clear_oneof_case_message"] =
      absl::StrCat(info->name, "Case_ = 0");
  (*variables)["has_oneof_case_message"] =
      absl::StrCat(info->name, "Case_ == ", descriptor->number());
}